

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Block::Parse(Block *this,Cluster *pCluster)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  longlong lVar5;
  ulong uVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  long *in_RSI;
  long *in_RDI;
  Frame *f_5;
  longlong total_size_2;
  Frame *curr_2;
  Frame *prev_1;
  longlong delta_size;
  longlong bias;
  long exp;
  longlong delta_size_;
  Frame *curr_1;
  Frame *prev;
  Frame *curr;
  Frame *pf_end_2;
  Frame *pf_2;
  longlong frame_size_4;
  int frame_count_1;
  longlong size_1;
  Frame *f_4;
  Frame *pf_end_1;
  Frame *pf_1;
  longlong frame_size_3;
  longlong total_size_1;
  Frame *f_3;
  longlong frame_size_2;
  longlong total_size;
  Frame *f_2;
  Frame *f_1;
  uchar val;
  long frame_size_1;
  int frame_count;
  longlong size;
  Frame *pf_end;
  Frame *pf;
  uchar biased_count;
  longlong frame_size;
  Frame *f;
  int lacing;
  longlong value;
  long status;
  IMkvReader *pReader;
  long len;
  longlong stop;
  longlong pos;
  void *local_1c0;
  long *in_stack_fffffffffffffe48;
  longlong *in_stack_fffffffffffffe50;
  IMkvReader *in_stack_fffffffffffffe58;
  IMkvReader *in_stack_fffffffffffffe68;
  long *local_138;
  long local_130;
  int local_124;
  long local_120;
  long *local_108;
  byte local_c1;
  long local_c0;
  int local_b4;
  long local_b0;
  long *local_a8;
  long *local_a0;
  undefined1 local_91;
  ulong local_90;
  void *local_88;
  byte local_79 [45];
  int local_4c;
  long local_48;
  long local_40;
  undefined8 *local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_8;
  
  if (in_RSI == (long *)0x0) {
    local_8 = -1;
  }
  else if (*in_RSI == 0) {
    local_8 = -1;
  }
  else {
    local_20 = *in_RDI;
    local_28 = *in_RDI + in_RDI[1];
    local_38 = *(undefined8 **)*in_RSI;
    lVar5 = ReadUInt(in_stack_fffffffffffffe58,(longlong)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
    in_RDI[2] = lVar5;
    if (in_RDI[2] < 1) {
      local_8 = -2;
    }
    else if (local_28 < local_20 + local_30) {
      local_8 = -2;
    }
    else {
      local_20 = local_30 + local_20;
      if (local_28 - local_20 < 2) {
        local_8 = -2;
      }
      else {
        local_40 = UnserializeInt(in_stack_fffffffffffffe68,(longlong)in_RDI,
                                  (longlong)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        if (local_40 == 0) {
          if (local_48 < -0x8000) {
            local_8 = -2;
          }
          else if (local_48 < 0x8000) {
            *(short *)(in_RDI + 3) = (short)local_48;
            local_20 = local_20 + 2;
            if (local_28 - local_20 < 1) {
              local_8 = -2;
            }
            else {
              iVar4 = (**(code **)*local_38)(local_38,local_20,1,(long)in_RDI + 0x1a);
              local_40 = (long)iVar4;
              if (local_40 == 0) {
                local_4c = (int)(*(byte *)((long)in_RDI + 0x1a) & 6) >> 1;
                local_20 = local_20 + 1;
                if (local_4c == 0) {
                  if (local_28 < local_20) {
                    local_8 = -2;
                  }
                  else {
                    *(undefined4 *)(in_RDI + 5) = 1;
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = (long)(int)in_RDI[5];
                    uVar6 = SUB168(auVar1 * ZEXT816(0x10),0);
                    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
                      uVar6 = 0xffffffffffffffff;
                    }
                    pvVar7 = operator_new__(uVar6,(nothrow_t *)&std::nothrow);
                    pvVar8 = (void *)0x0;
                    if (pvVar7 != (void *)0x0) {
                      pvVar8 = pvVar7;
                    }
                    in_RDI[4] = (long)pvVar8;
                    if (in_RDI[4] == 0) {
                      local_8 = -1;
                    }
                    else {
                      plVar10 = (long *)in_RDI[4];
                      *plVar10 = local_20;
                      if (local_28 - local_20 < 1) {
                        local_8 = -2;
                      }
                      else {
                        plVar10[1] = local_28 - local_20;
                        local_8 = 0;
                      }
                    }
                  }
                }
                else if (local_20 < local_28) {
                  iVar4 = (**(code **)*local_38)(local_38,local_20,1,local_79);
                  local_40 = (long)iVar4;
                  if (local_40 == 0) {
                    local_20 = local_20 + 1;
                    if (local_28 < local_20) {
                      local_8 = -2;
                    }
                    else {
                      *(uint *)(in_RDI + 5) = local_79[0] + 1;
                      auVar2._8_8_ = 0;
                      auVar2._0_8_ = (long)(int)in_RDI[5];
                      uVar6 = SUB168(auVar2 * ZEXT816(0x10),0);
                      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
                        uVar6 = 0xffffffffffffffff;
                      }
                      pvVar8 = operator_new__(uVar6,(nothrow_t *)&std::nothrow);
                      local_91 = pvVar8 != (void *)0x0;
                      local_1c0 = (void *)0x0;
                      if ((bool)local_91) {
                        local_1c0 = pvVar8;
                        local_90 = uVar6;
                        local_88 = pvVar8;
                      }
                      in_RDI[4] = (long)local_1c0;
                      if (in_RDI[4] == 0) {
                        local_8 = -1;
                      }
                      else if (in_RDI[4] == 0) {
                        local_8 = -2;
                      }
                      else {
                        if (local_4c == 1) {
                          local_a8 = (long *)in_RDI[4] + (long)(int)in_RDI[5] * 2;
                          local_b0 = 0;
                          local_a0 = (long *)in_RDI[4];
                          for (local_b4 = (int)in_RDI[5]; 1 < local_b4; local_b4 = local_b4 + -1) {
                            local_c0 = 0;
                            do {
                              if (local_28 <= local_20) {
                                return -2;
                              }
                              iVar4 = (**(code **)*local_38)(local_38,local_20,1,&local_c1);
                              if (iVar4 != 0) {
                                return -2;
                              }
                              local_20 = local_20 + 1;
                              local_c0 = (ulong)local_c1 + local_c0;
                              local_40 = 0;
                            } while (local_c1 == 0xff);
                            if (local_a8 <= local_a0 + 2) {
                              return -2;
                            }
                            *local_a0 = 0;
                            if (local_c0 < 1) {
                              return -2;
                            }
                            local_a0[1] = local_c0;
                            local_b0 = local_c0 + local_b0;
                            local_a0 = local_a0 + 2;
                          }
                          if ((local_a8 <= local_a0) || (local_28 < local_20)) {
                            return -2;
                          }
                          if (local_a0 + 2 != local_a8) {
                            return -2;
                          }
                          *local_a0 = 0;
                          if (local_28 - local_20 < local_b0) {
                            return -2;
                          }
                          local_b0 = (local_28 - local_20) - local_b0;
                          if (local_b0 < 1) {
                            return -2;
                          }
                          local_a0[1] = local_b0;
                          local_a0 = (long *)in_RDI[4];
                          while (local_a0 != local_a8) {
                            if (local_28 < local_20 + local_a0[1]) {
                              return -2;
                            }
                            *local_a0 = local_20;
                            local_20 = local_a0[1] + local_20;
                            local_a0 = local_a0 + 2;
                          }
                          if (local_20 != local_28) {
                            return -2;
                          }
                        }
                        else if (local_4c == 2) {
                          if (local_28 <= local_20) {
                            return -2;
                          }
                          if ((local_28 - local_20) % (long)(int)in_RDI[5] != 0) {
                            return -2;
                          }
                          lVar9 = (local_28 - local_20) / (long)(int)in_RDI[5];
                          if (lVar9 < 1) {
                            return -2;
                          }
                          plVar10 = (long *)in_RDI[4];
                          lVar3 = in_RDI[5];
                          local_108 = plVar10;
                          while (local_108 != plVar10 + (long)(int)lVar3 * 2) {
                            if (local_28 < local_20 + lVar9) {
                              return -2;
                            }
                            *local_108 = local_20;
                            local_108[1] = lVar9;
                            local_20 = lVar9 + local_20;
                            local_108 = local_108 + 2;
                          }
                          if (local_20 != local_28) {
                            return -2;
                          }
                        }
                        else {
                          if (local_28 <= local_20) {
                            return -2;
                          }
                          local_124 = (int)in_RDI[5];
                          local_130 = ReadUInt(in_stack_fffffffffffffe58,
                                               (longlong)in_stack_fffffffffffffe50,
                                               in_stack_fffffffffffffe48);
                          if (local_130 < 1) {
                            return -2;
                          }
                          if (0x7fffffffffffffff < local_130) {
                            return -2;
                          }
                          if (local_28 < local_20 + local_30) {
                            return -2;
                          }
                          local_20 = local_30 + local_20;
                          if (local_28 < local_20 + local_130) {
                            return -2;
                          }
                          local_138 = (long *)in_RDI[4];
                          plVar10 = local_138 + (long)(int)in_RDI[5] * 2;
                          *local_138 = 0;
                          local_138[1] = local_130;
                          local_120 = local_138[1];
                          while (local_124 = local_124 + -1, 1 < local_124) {
                            if (local_28 <= local_20) {
                              return -2;
                            }
                            if (plVar10 <= local_138) {
                              return -2;
                            }
                            plVar11 = local_138 + 2;
                            if (local_138[1] != local_130) {
                              return -2;
                            }
                            if (plVar10 <= plVar11) {
                              return -2;
                            }
                            *plVar11 = 0;
                            lVar5 = ReadUInt(in_stack_fffffffffffffe58,
                                             (longlong)in_stack_fffffffffffffe50,
                                             in_stack_fffffffffffffe48);
                            if (lVar5 < 0) {
                              return -2;
                            }
                            if (local_28 < local_20 + local_30) {
                              return -2;
                            }
                            local_20 = local_30 + local_20;
                            if (local_28 < local_20) {
                              return -2;
                            }
                            local_130 = (lVar5 - ((1L << ((char)local_30 * '\a' - 1U & 0x3f)) + -1))
                                        + local_130;
                            if (local_130 < 1) {
                              return -2;
                            }
                            if (0x7fffffffffffffff < local_130) {
                              return -2;
                            }
                            local_138[3] = local_130;
                            if (0x7fffffffffffffff - local_138[3] < local_120) {
                              return -2;
                            }
                            local_120 = local_138[3] + local_120;
                            local_138 = plVar11;
                          }
                          if (0 < local_124) {
                            if ((local_28 < local_20) || (plVar10 <= local_138)) {
                              return -2;
                            }
                            if (local_138[1] != local_130) {
                              return -2;
                            }
                            if (plVar10 <= local_138 + 2) {
                              return -2;
                            }
                            if (local_138 + 4 != plVar10) {
                              return -2;
                            }
                            local_138[2] = 0;
                            if (local_28 - local_20 < local_120) {
                              return -2;
                            }
                            local_120 = (local_28 - local_20) - local_120;
                            if (local_120 < 1) {
                              return -2;
                            }
                            local_138[3] = local_120;
                          }
                          local_138 = (long *)in_RDI[4];
                          while (local_138 != plVar10) {
                            if (local_28 < local_20 + local_138[1]) {
                              return -2;
                            }
                            *local_138 = local_20;
                            local_20 = local_138[1] + local_20;
                            local_138 = local_138 + 2;
                          }
                          if (local_20 != local_28) {
                            return -2;
                          }
                        }
                        local_8 = 0;
                      }
                    }
                  }
                  else {
                    local_8 = -2;
                  }
                }
                else {
                  local_8 = -2;
                }
              }
              else {
                local_8 = -2;
              }
            }
          }
          else {
            local_8 = -2;
          }
        }
        else {
          local_8 = -2;
        }
      }
    }
  }
  return local_8;
}

Assistant:

long Block::Parse(const Cluster* pCluster) {
  if (pCluster == NULL)
    return -1;

  if (pCluster->m_pSegment == NULL)
    return -1;

  assert(m_start >= 0);
  assert(m_size >= 0);
  assert(m_track <= 0);
  assert(m_frames == NULL);
  assert(m_frame_count <= 0);

  long long pos = m_start;
  const long long stop = m_start + m_size;

  long len;

  IMkvReader* const pReader = pCluster->m_pSegment->m_pReader;

  m_track = ReadUInt(pReader, pos, len);

  if (m_track <= 0)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > stop)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((stop - pos) < 2)
    return E_FILE_FORMAT_INVALID;

  long status;
  long long value;

  status = UnserializeInt(pReader, pos, 2, value);

  if (status)
    return E_FILE_FORMAT_INVALID;

  if (value < SHRT_MIN)
    return E_FILE_FORMAT_INVALID;

  if (value > SHRT_MAX)
    return E_FILE_FORMAT_INVALID;

  m_timecode = static_cast<short>(value);

  pos += 2;

  if ((stop - pos) <= 0)
    return E_FILE_FORMAT_INVALID;

  status = pReader->Read(pos, 1, &m_flags);

  if (status)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(m_flags & 0x06) >> 1;

  ++pos;  // consume flags byte

  if (lacing == 0) {  // no lacing
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;

    m_frame_count = 1;
    m_frames = new (std::nothrow) Frame[m_frame_count];
    if (m_frames == NULL)
      return -1;

    Frame& f = m_frames[0];
    f.pos = pos;

    const long long frame_size = stop - pos;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    f.len = static_cast<long>(frame_size);

    return 0;  // success
  }

  if (pos >= stop)
    return E_FILE_FORMAT_INVALID;

  unsigned char biased_count;

  status = pReader->Read(pos, 1, &biased_count);

  if (status)
    return E_FILE_FORMAT_INVALID;

  ++pos;  // consume frame count
  if (pos > stop)
    return E_FILE_FORMAT_INVALID;

  m_frame_count = int(biased_count) + 1;

  m_frames = new (std::nothrow) Frame[m_frame_count];
  if (m_frames == NULL)
    return -1;

  if (!m_frames)
    return E_FILE_FORMAT_INVALID;

  if (lacing == 1) {  // Xiph
    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    long long size = 0;
    int frame_count = m_frame_count;

    while (frame_count > 1) {
      long frame_size = 0;

      for (;;) {
        unsigned char val;

        if (pos >= stop)
          return E_FILE_FORMAT_INVALID;

        status = pReader->Read(pos, 1, &val);

        if (status)
          return E_FILE_FORMAT_INVALID;

        ++pos;  // consume xiph size byte

        frame_size += val;

        if (val < 255)
          break;
      }

      Frame& f = *pf++;
      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = frame_size;
      size += frame_size;  // contribution of this frame

      --frame_count;
    }

    if (pf >= pf_end || pos > stop)
      return E_FILE_FORMAT_INVALID;

    {
      Frame& f = *pf++;

      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      const long long frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      assert((pos + f.len) <= stop);

      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else if (lacing == 2) {  // fixed-size lacing
    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    const long long total_size = stop - pos;

    if ((total_size % m_frame_count) != 0)
      return E_FILE_FORMAT_INVALID;

    const long long frame_size = total_size / m_frame_count;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    while (pf != pf_end) {
      assert((pos + frame_size) <= stop);
      if ((pos + frame_size) > stop)
        return E_FILE_FORMAT_INVALID;

      Frame& f = *pf++;

      f.pos = pos;
      f.len = static_cast<long>(frame_size);

      pos += frame_size;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else {
    assert(lacing == 3);  // EBML lacing

    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    long long size = 0;
    int frame_count = m_frame_count;

    long long frame_size = ReadUInt(pReader, pos, len);

    if (frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    if (frame_size > LONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume length of size of first frame

    if ((pos + frame_size) > stop)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    {
      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      curr.len = static_cast<long>(frame_size);
      size += curr.len;  // contribution of this frame
    }

    --frame_count;

    while (frame_count > 1) {
      if (pos >= stop)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      const long long delta_size_ = ReadUInt(pReader, pos, len);

      if (delta_size_ < 0)
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > stop)
        return E_FILE_FORMAT_INVALID;

      pos += len;  // consume length of (delta) size
      if (pos > stop)
        return E_FILE_FORMAT_INVALID;

      const long exp = 7 * len - 1;
      const long long bias = (1LL << exp) - 1LL;
      const long long delta_size = delta_size_ - bias;

      frame_size += delta_size;

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      if (frame_size > LONG_MAX)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
      // Check if size + curr.len could overflow.
      if (size > LLONG_MAX - curr.len) {
        return E_FILE_FORMAT_INVALID;
      }
      size += curr.len;  // contribution of this frame

      --frame_count;
    }

    // parse last frame
    if (frame_count > 0) {
      if (pos > stop || pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf++;
      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      curr.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    if (pos != stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;  // success
}